

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int windowCodeOp(WindowCodeArg *p,int op,int regCountdown,int jumpOnEof)

{
  u8 uVar1;
  byte bVar2;
  int nReg;
  Parse *pParse;
  Window *pMWin;
  Vdbe *p_00;
  uint uVar3;
  int reg;
  Op *pOVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_48;
  int local_44;
  
  pParse = p->pParse;
  pMWin = p->pMWin;
  p_00 = p->pVdbe;
  uVar1 = pMWin->eFrmType;
  iVar6 = pParse->nLabel + -1;
  pParse->nLabel = iVar6;
  if ((op == 2) && (pMWin->eStart == 'W')) {
    return 0;
  }
  local_44 = 0;
  local_50 = 0;
  if (regCountdown < 1) {
LAB_0018b033:
    if (op == 1) {
LAB_0018b03d:
      if (pMWin->regStartRowid == 0) {
        windowAggFinal((WindowCodeArg *)p->pParse,(int)p->pMWin);
      }
      local_54 = p_00->nOp;
      local_58 = (p->current).csr;
      local_48 = (p->current).reg;
      windowReturnOneRow(p);
    }
    else {
      local_44 = 0;
      local_54 = p_00->nOp;
      if (op == 2) goto LAB_0018b0a6;
LAB_0018b127:
      local_58 = (p->end).csr;
      local_48 = (p->end).reg;
      if (pMWin->regStartRowid != 0) {
        iVar8 = pMWin->regEndRowid;
        goto LAB_0018b149;
      }
      iVar8 = p->regArg;
      iVar7 = 0;
LAB_0018b16c:
      windowAggStep(pParse,pMWin,local_58,iVar7,iVar8);
    }
  }
  else {
    if (uVar1 != 'V') {
      local_50 = sqlite3VdbeAddOp3(p_00,0x2f,regCountdown,0,1);
      goto LAB_0018b033;
    }
    local_44 = p_00->nOp;
    if (op != 2) {
      windowCodeRangeTest(p,0x36,(p->end).csr,regCountdown,(p->current).csr,iVar6);
      if (op != 1) {
        local_54 = p_00->nOp;
        local_50 = 0;
        goto LAB_0018b127;
      }
      local_50 = 0;
      goto LAB_0018b03d;
    }
    bVar9 = pMWin->eStart == 'S';
    uVar3 = (uint)!bVar9;
    windowCodeRangeTest(p,uVar3 * 2 + 0x37,(&p->start)[bVar9].csr,regCountdown,
                        (&p->start)[uVar3].csr,iVar6);
    local_54 = p_00->nOp;
    local_50 = 0;
LAB_0018b0a6:
    local_58 = (p->start).csr;
    local_48 = (p->start).reg;
    iVar8 = pMWin->regStartRowid;
    if (iVar8 == 0) {
      iVar8 = p->regArg;
      iVar7 = 1;
      goto LAB_0018b16c;
    }
LAB_0018b149:
    sqlite3VdbeAddOp3(p_00,0x53,iVar8,1,0);
  }
  if (p->eDelete == op) {
    sqlite3VdbeAddOp3(p_00,0x7b,local_58,0,0);
    if (0 < (long)p_00->nOp) {
      p_00->aOp[(long)p_00->nOp + -1].p5 = 2;
    }
  }
  if (jumpOnEof == 0) {
    local_5c = 0;
    sqlite3VdbeAddOp3(p_00,5,local_58,(p_00->nOp - (uint)(uVar1 == 'L')) + 2,0);
    iVar8 = 0;
    if (uVar1 == 'L') goto LAB_0018b307;
    local_5c = 0;
    iVar8 = sqlite3VdbeAddOp3(p_00,0xb,0,0,0);
  }
  else {
    iVar8 = 0;
    sqlite3VdbeAddOp3(p_00,5,local_58,p_00->nOp + 2,0);
    local_5c = sqlite3VdbeAddOp3(p_00,0xb,0,0,0);
    if (uVar1 == 'L') goto LAB_0018b307;
  }
  iVar7 = 0;
  if (pMWin->pOrderBy == (ExprList *)0x0) {
    reg = 0;
  }
  else {
    nReg = pMWin->pOrderBy->nExpr;
    reg = 0;
    if (nReg != 0) {
      reg = sqlite3GetTempRange(pParse,nReg);
      iVar7 = nReg;
    }
  }
  windowReadPeerValues(p,local_58,reg);
  windowIfNewPeer(pParse,pMWin->pOrderBy,reg,local_48,local_54);
  if (iVar7 == 1) {
    if (reg == 0) goto LAB_0018b307;
    bVar2 = pParse->nTempReg;
    if (7 < (ulong)bVar2) goto LAB_0018b307;
    pParse->nTempReg = bVar2 + 1;
    piVar5 = pParse->aTempReg + bVar2;
  }
  else {
    if (iVar7 <= pParse->nRangeReg) goto LAB_0018b307;
    pParse->nRangeReg = iVar7;
    piVar5 = &pParse->iRangeReg;
  }
  *piVar5 = reg;
LAB_0018b307:
  if (local_44 != 0) {
    sqlite3VdbeAddOp3(p_00,0xb,0,local_44,0);
  }
  sqlite3VdbeResolveLabel(p_00,iVar6);
  if (iVar8 != 0) {
    if (p_00->db->mallocFailed == '\0') {
      iVar6 = p_00->nOp + -1;
      if (-1 < iVar8) {
        iVar6 = iVar8;
      }
      pOVar4 = p_00->aOp + iVar6;
    }
    else {
      pOVar4 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar4->p2 = p_00->nOp;
  }
  if (local_50 != 0) {
    if (p_00->db->mallocFailed == '\0') {
      iVar6 = p_00->nOp + -1;
      if (-1 < local_50) {
        iVar6 = local_50;
      }
      pOVar4 = p_00->aOp + iVar6;
    }
    else {
      pOVar4 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar4->p2 = p_00->nOp;
  }
  return local_5c;
}

Assistant:

static int windowCodeOp(
 WindowCodeArg *p,                /* Context object */
 int op,                          /* WINDOW_RETURN_ROW, AGGSTEP or AGGINVERSE */
 int regCountdown,                /* Register for OP_IfPos countdown */
 int jumpOnEof                    /* Jump here if stepped cursor reaches EOF */
){
  int csr, reg;
  Parse *pParse = p->pParse;
  Window *pMWin = p->pMWin;
  int ret = 0;
  Vdbe *v = p->pVdbe;
  int addrIf = 0; 
  int addrContinue = 0;
  int addrGoto = 0;
  int bPeer = (pMWin->eFrmType!=TK_ROWS);

  int lblDone = sqlite3VdbeMakeLabel(pParse);
  int addrNextRange = 0;

  /* Special case - WINDOW_AGGINVERSE is always a no-op if the frame
  ** starts with UNBOUNDED PRECEDING. */
  if( op==WINDOW_AGGINVERSE && pMWin->eStart==TK_UNBOUNDED ){
    assert( regCountdown==0 && jumpOnEof==0 );
    return 0;
  }

  if( regCountdown>0 ){
    if( pMWin->eFrmType==TK_RANGE ){
      addrNextRange = sqlite3VdbeCurrentAddr(v);
      assert( op==WINDOW_AGGINVERSE || op==WINDOW_AGGSTEP );
      if( op==WINDOW_AGGINVERSE ){
        if( pMWin->eStart==TK_FOLLOWING ){
          windowCodeRangeTest(
              p, OP_Le, p->current.csr, regCountdown, p->start.csr, lblDone
          );
        }else{
          windowCodeRangeTest(
              p, OP_Ge, p->start.csr, regCountdown, p->current.csr, lblDone
          );
        }
      }else{
        windowCodeRangeTest(
            p, OP_Gt, p->end.csr, regCountdown, p->current.csr, lblDone
        );
      }
    }else{
      addrIf = sqlite3VdbeAddOp3(v, OP_IfPos, regCountdown, 0, 1);
      VdbeCoverage(v);
    }
  }

  if( op==WINDOW_RETURN_ROW && pMWin->regStartRowid==0 ){
    windowAggFinal(p, 0);
  }
  addrContinue = sqlite3VdbeCurrentAddr(v);
  switch( op ){
    case WINDOW_RETURN_ROW:
      csr = p->current.csr;
      reg = p->current.reg;
      windowReturnOneRow(p);
      break;

    case WINDOW_AGGINVERSE:
      csr = p->start.csr;
      reg = p->start.reg;
      if( pMWin->regStartRowid ){
        assert( pMWin->regEndRowid );
        sqlite3VdbeAddOp2(v, OP_AddImm, pMWin->regStartRowid, 1);
      }else{
        windowAggStep(pParse, pMWin, csr, 1, p->regArg);
      }
      break;

    default:
      assert( op==WINDOW_AGGSTEP );
      csr = p->end.csr;
      reg = p->end.reg;
      if( pMWin->regStartRowid ){
        assert( pMWin->regEndRowid );
        sqlite3VdbeAddOp2(v, OP_AddImm, pMWin->regEndRowid, 1);
      }else{
        windowAggStep(pParse, pMWin, csr, 0, p->regArg);
      }
      break;
  }

  if( op==p->eDelete ){
    sqlite3VdbeAddOp1(v, OP_Delete, csr);
    sqlite3VdbeChangeP5(v, OPFLAG_SAVEPOSITION);
  }

  if( jumpOnEof ){
    sqlite3VdbeAddOp2(v, OP_Next, csr, sqlite3VdbeCurrentAddr(v)+2);
    VdbeCoverage(v);
    ret = sqlite3VdbeAddOp0(v, OP_Goto);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, csr, sqlite3VdbeCurrentAddr(v)+1+bPeer);
    VdbeCoverage(v);
    if( bPeer ){
      addrGoto = sqlite3VdbeAddOp0(v, OP_Goto);
    }
  }

  if( bPeer ){
    int nReg = (pMWin->pOrderBy ? pMWin->pOrderBy->nExpr : 0);
    int regTmp = (nReg ? sqlite3GetTempRange(pParse, nReg) : 0);
    windowReadPeerValues(p, csr, regTmp);
    windowIfNewPeer(pParse, pMWin->pOrderBy, regTmp, reg, addrContinue);
    sqlite3ReleaseTempRange(pParse, regTmp, nReg);
  }

  if( addrNextRange ){
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrNextRange);
  }
  sqlite3VdbeResolveLabel(v, lblDone);
  if( addrGoto ) sqlite3VdbeJumpHere(v, addrGoto);
  if( addrIf ) sqlite3VdbeJumpHere(v, addrIf);
  return ret;
}